

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O3

void __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>::InitializeStaticSRBResources
          (PipelineResourceSignatureBase<Diligent::EngineGLImplTraits> *this,
          IShaderResourceBinding *pSRB)

{
  _func_int **pp_Var1;
  char cVar2;
  char (*in_R8) [3];
  string msg;
  string local_38;
  
  if (pSRB == (IShaderResourceBinding *)0x0) {
    FormatString<char[21]>(&local_38,(char (*) [21])"SRB must not be null");
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"InitializeStaticSRBResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
               ,0x221);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    CheckDynamicType<Diligent::ShaderResourceBindingGLImpl,Diligent::IShaderResourceBinding>(pSRB);
  }
  if (*(char *)&pSRB[0xe].super_IObject._vptr_IObject == '\x01') {
    FormatString<char[87]>
              (&local_38,
               (char (*) [87])
               "Static resources have already been initialized in this shader resource binding object."
              );
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(1,local_38._M_dataplus._M_p,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    pp_Var1 = pSRB[2].super_IObject._vptr_IObject;
    cVar2 = (**(code **)(*pp_Var1 + 0x78))(pp_Var1,this);
    if (cVar2 == '\0') {
      FormatString<char[68],char_const*,char[3]>
                (&local_38,
                 (Diligent *)"Shader resource binding is not compatible with resource signature \'",
                 (char (*) [68])
                 &(this->
                  super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
                  ).m_Desc,(char **)"\'.",in_R8);
      DebugAssertionFailed
                (local_38._M_dataplus._M_p,"InitializeStaticSRBResources",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineResourceSignatureBase.hpp"
                 ,0x22e);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
    PipelineResourceSignatureGLImpl::CopyStaticResources
              ((PipelineResourceSignatureGLImpl *)this,(ShaderResourceCacheGL *)(pSRB + 4));
    ShaderResourceBindingBase<Diligent::EngineGLImplTraits>::SetStaticResourcesInitialized
              ((ShaderResourceBindingBase<Diligent::EngineGLImplTraits> *)pSRB);
  }
  return;
}

Assistant:

InitializeStaticSRBResources(IShaderResourceBinding* pSRB) const override final
    {
        DEV_CHECK_ERR(pSRB != nullptr, "SRB must not be null");

        ShaderResourceBindingImplType* const pSRBImpl = ClassPtrCast<ShaderResourceBindingImplType>(pSRB);
        if (pSRBImpl->StaticResourcesInitialized())
        {
            LOG_WARNING_MESSAGE("Static resources have already been initialized in this shader resource binding object.");
            return;
        }

        const PipelineResourceSignatureImplType* const pThisImpl = static_cast<const PipelineResourceSignatureImplType*>(this);
#ifdef DILIGENT_DEVELOPMENT
        {
            const IPipelineResourceSignature* pSRBSignature = pSRBImpl->GetPipelineResourceSignature();
            DEV_CHECK_ERR(pSRBSignature->IsCompatibleWith(pThisImpl), "Shader resource binding is not compatible with resource signature '", pThisImpl->m_Desc.Name, "'.");
        }
#endif

        auto& ResourceCache = pSRBImpl->GetResourceCache();
        pThisImpl->CopyStaticResources(ResourceCache);

        pSRBImpl->SetStaticResourcesInitialized();
    }